

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstSerialise.cpp
# Opt level: O2

string * __thiscall
enact::AstSerialise::visitTraitStmt_abi_cxx11_
          (string *__return_storage_ptr__,AstSerialise *this,TraitStmt *stmt)

{
  string *psVar1;
  pointer puVar2;
  FunctionStmt *pFVar3;
  ostream *poVar4;
  pointer puVar5;
  string local_1d8 [32];
  stringstream s;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&s);
  psVar1 = &this->m_ident;
  poVar4 = std::operator<<(local_1a8,(string *)psVar1);
  poVar4 = std::operator<<(poVar4,"(Stmt::Trait ");
  poVar4 = std::operator<<(poVar4,(string *)&(stmt->name).lexeme);
  std::operator<<(poVar4," (\n");
  std::__cxx11::string::append((char *)psVar1);
  puVar2 = (stmt->methods).
           super__Vector_base<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>,_std::allocator<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar5 = (stmt->methods).
                super__Vector_base<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>,_std::allocator<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar5 != puVar2; puVar5 = puVar5 + 1) {
    poVar4 = std::operator<<(local_1a8,(string *)psVar1);
    pFVar3 = (puVar5->_M_t).
             super___uniq_ptr_impl<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>.
             _M_t.
             super__Tuple_impl<0UL,_enact::FunctionStmt_*,_std::default_delete<enact::FunctionStmt>_>
             .super__Head_base<0UL,_enact::FunctionStmt_*,_false>._M_head_impl;
    (*(pFVar3->super_Stmt)._vptr_Stmt[2])(local_1d8,pFVar3,this);
    poVar4 = std::operator<<(poVar4,local_1d8);
    std::operator<<(poVar4,"\n");
    std::__cxx11::string::~string(local_1d8);
  }
  std::__cxx11::string::erase((ulong)psVar1,0);
  std::operator<<(local_1a8,")");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&s);
  return __return_storage_ptr__;
}

Assistant:

std::string AstSerialise::visitTraitStmt(TraitStmt &stmt) {
        std::stringstream s;

        s << m_ident << "(Stmt::Trait " << stmt.name.lexeme << " (\n";
        m_ident += "    ";

        for (auto &method : stmt.methods) {
            s << m_ident << visitStmt(*method) << "\n";
        }

        m_ident.erase(0, 4);
        s << ")";

        return s.str();
    }